

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_comments_1(void)

{
  run("comment blocks should be removed from the template","12345{{! Comment Block! }}67890","{}",
      (char *)0x0,"1234567890");
  return;
}

Assistant:

static void
test_comments_1(void)
{
    run(
        "comment blocks should be removed from the template",
        "12345{{! Comment Block! }}67890",
        "{}",
        NULL,
        "1234567890"
    );
}